

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

void xmlFreeNode(xmlNodePtr cur)

{
  xmlElementType xVar1;
  int iVar2;
  xmlDeregisterNodeFunc *pp_Var3;
  xmlChar *pxVar4;
  _xmlDict *dict;
  
  if (cur == (xmlNodePtr)0x0) {
    return;
  }
  xVar1 = cur->type;
  if (xVar1 == XML_ATTRIBUTE_NODE) {
    xmlFreeProp((xmlAttrPtr)cur);
    return;
  }
  if (xVar1 == XML_NAMESPACE_DECL) {
    xmlFreeNs((xmlNsPtr)cur);
    return;
  }
  if (xVar1 == XML_ENTITY_DECL) {
    xmlFreeEntity((xmlEntityPtr)cur);
    return;
  }
  if (xVar1 == XML_DTD_NODE) {
    xmlFreeDtd((xmlDtdPtr)cur);
    return;
  }
  if (xmlRegisterCallbacks != 0) {
    pp_Var3 = __xmlDeregisterNodeDefaultValue();
    if (*pp_Var3 != (xmlDeregisterNodeFunc)0x0) {
      pp_Var3 = __xmlDeregisterNodeDefaultValue();
      (**pp_Var3)(cur);
    }
  }
  if (cur->doc == (_xmlDoc *)0x0) {
    dict = (xmlDictPtr)0x0;
  }
  else {
    dict = cur->doc->dict;
  }
  xVar1 = cur->type;
  if (cur->children == (xmlNodePtr)0x0) {
LAB_0014904f:
    if ((XML_XINCLUDE_END < xVar1) ||
       ((0x180002U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0)) goto LAB_0014907c;
    if (cur->properties != (xmlAttrPtr)0x0) {
      xmlFreePropList(cur->properties);
    }
    if (cur->nsDef != (xmlNsPtr)0x0) {
      xmlFreeNsList(cur->nsDef);
    }
  }
  else {
    if (xVar1 != XML_ENTITY_REF_NODE) {
      xmlFreeNodeList(cur->children);
      xVar1 = cur->type;
      goto LAB_0014904f;
    }
    xVar1 = XML_ENTITY_REF_NODE;
LAB_0014907c:
    pxVar4 = cur->content;
    if ((_xmlAttr **)pxVar4 != &cur->properties &&
        (xVar1 != XML_ENTITY_REF_NODE && pxVar4 != (xmlChar *)0x0)) {
      if (dict != (xmlDictPtr)0x0) {
        iVar2 = xmlDictOwns(dict,pxVar4);
        if (iVar2 != 0) goto LAB_001490bd;
        pxVar4 = cur->content;
      }
      (*xmlFree)(pxVar4);
    }
  }
LAB_001490bd:
  pxVar4 = cur->name;
  if (((pxVar4 != (xmlChar *)0x0) && (cur->type != XML_TEXT_NODE)) &&
     (cur->type != XML_COMMENT_NODE)) {
    if (dict != (xmlDictPtr)0x0) {
      iVar2 = xmlDictOwns(dict,pxVar4);
      if (iVar2 != 0) goto LAB_001490f4;
      pxVar4 = cur->name;
    }
    (*xmlFree)(pxVar4);
  }
LAB_001490f4:
  (*xmlFree)(cur);
  return;
}

Assistant:

void
xmlFreeNode(xmlNodePtr cur) {
    xmlDictPtr dict = NULL;

    if (cur == NULL) return;

    /* use xmlFreeDtd for DTD nodes */
    if (cur->type == XML_DTD_NODE) {
	xmlFreeDtd((xmlDtdPtr) cur);
	return;
    }
    if (cur->type == XML_NAMESPACE_DECL) {
	xmlFreeNs((xmlNsPtr) cur);
        return;
    }
    if (cur->type == XML_ATTRIBUTE_NODE) {
	xmlFreeProp((xmlAttrPtr) cur);
	return;
    }
    if (cur->type == XML_ENTITY_DECL) {
        xmlFreeEntity((xmlEntityPtr) cur);
        return;
    }

    if ((xmlRegisterCallbacks) && (xmlDeregisterNodeDefaultValue))
	xmlDeregisterNodeDefaultValue(cur);

    if (cur->doc != NULL) dict = cur->doc->dict;

    if ((cur->children != NULL) &&
	(cur->type != XML_ENTITY_REF_NODE))
	xmlFreeNodeList(cur->children);

    if ((cur->type == XML_ELEMENT_NODE) ||
        (cur->type == XML_XINCLUDE_START) ||
        (cur->type == XML_XINCLUDE_END)) {
        if (cur->properties != NULL)
            xmlFreePropList(cur->properties);
        if (cur->nsDef != NULL)
            xmlFreeNsList(cur->nsDef);
    } else if ((cur->content != NULL) &&
               (cur->type != XML_ENTITY_REF_NODE) &&
               (cur->content != (xmlChar *) &(cur->properties))) {
        DICT_FREE(cur->content)
    }

    /*
     * When a node is a text node or a comment, it uses a global static
     * variable for the name of the node.
     * Otherwise the node name might come from the document's dictionary
     */
    if ((cur->name != NULL) &&
        (cur->type != XML_TEXT_NODE) &&
        (cur->type != XML_COMMENT_NODE))
	DICT_FREE(cur->name)

    xmlFree(cur);
}